

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O2

decNumber * decExpOp(decNumber *res,decNumber *rhs,decContext *set,uint32_t *status)

{
  long lVar1;
  long lVar2;
  byte bVar3;
  uint uVar4;
  bool bVar5;
  decContext *set_00;
  int32_t iVar6;
  decNumber *res_00;
  decNumber *dest;
  int iVar7;
  uint32_t uVar8;
  decNumber *pdVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  decNumber *local_288;
  int32_t residue;
  decNumber *local_278;
  decNumber *local_270;
  decNumber *local_268;
  long local_260;
  uint local_258;
  uint32_t ignore;
  ulong local_250;
  decContext *local_248;
  decContext local_240;
  decNumber local_224;
  decContext dset;
  decContext tset;
  decNumber local_1d8 [4];
  decNumber buft [8];
  decNumber local_148 [16];
  decNumber bufr [7];
  
  ignore = 0;
  bVar3 = rhs->bits;
  if ((bVar3 & 0x70) != 0) {
    if ((bVar3 & 0x40) == 0) {
      decNaNs(res,rhs,(decNumber *)0x0,set,status);
      return res;
    }
    if (-1 < (char)bVar3) {
      uprv_decNumberCopy_63(res,rhs);
      return res;
    }
    res->bits = '\0';
    res->lsu[0] = '\0';
LAB_002c2f7b:
    res->digits = 1;
    res->exponent = 0;
    return res;
  }
  if ((rhs->lsu[0] == '\0') && (rhs->digits == 1)) {
    res->bits = '\0';
    res->lsu[0] = '\x01';
    goto LAB_002c2f7b;
  }
  local_1d8[0].bits = '\0';
  local_1d8[0].lsu[0] = '\x04';
  local_1d8[0].exponent = ~set->digits;
  if (-1 < (char)bVar3) {
    local_1d8[0].exponent = -set->digits;
  }
  local_1d8[0].digits = 1;
  iVar6 = decCompare(local_1d8,rhs,'\x01');
  if (-1 < iVar6) {
    iVar7 = set->digits;
    res->bits = '\0';
    res->lsu[0] = '\x01';
    res->digits = 1;
    res->exponent = 0;
    iVar6 = decShiftToMost(res->lsu,1,iVar7 + -1);
    res->digits = iVar6;
    res->exponent = 1 - iVar7;
    *status = *status | 0x820;
    return res;
  }
  uprv_decContextDefault_63(&local_240,0x40);
  local_240.emax = set->emax;
  local_240.emin = set->emin;
  local_240.clamp = '\0';
  uVar11 = rhs->digits;
  iVar7 = uVar11 + rhs->exponent;
  local_248 = set;
  if (iVar7 < 9) {
    local_258 = 8U - iVar7;
    if ((uint)(8 < (int)uVar11) <= 8U - iVar7) {
      local_258 = (uint)(8 < (int)uVar11);
    }
    iVar10 = uVar11 + local_258;
    local_258 = local_258 + iVar7;
    uVar12 = 0;
    if (0 < (int)local_258) {
      uVar12 = (ulong)local_258;
    }
    if (rhs->exponent == -iVar10 || (int)local_258 < 0) {
      local_270 = (decNumber *)0x0;
      pdVar9 = rhs;
    }
    else {
      if ((int)uVar11 < 0x32) {
        uVar11 = (uint)""[(int)uVar11];
      }
      if (uVar11 < 0x4a) {
        pdVar9 = bufr;
        local_270 = (decNumber *)0x0;
      }
      else {
        local_270 = (decNumber *)uprv_malloc_63((ulong)(uVar11 + 0xb));
        pdVar9 = local_270;
        if (local_270 == (decNumber *)0x0) {
          *(byte *)status = (byte)*status | 0x10;
          return res;
        }
      }
      uprv_decNumberCopy_63(pdVar9,rhs);
      pdVar9->exponent = -iVar10;
      uVar11 = pdVar9->digits;
    }
    uVar4 = set->digits;
    if (set->digits < (int)uVar11) {
      uVar4 = uVar11;
    }
    iVar7 = uVar4 + (int)uVar12;
    lVar1 = (long)iVar7 * 2;
    lVar2 = lVar1 + 4;
    uVar11 = (uint)lVar2;
    if (iVar7 < 0x17) {
      uVar11 = (uint)""[lVar1 + 4];
    }
    local_250 = uVar12;
    if (uVar11 + 0xb < 0xb5) {
      res_00 = local_148;
      local_288 = (decNumber *)0x0;
    }
    else {
      res_00 = (decNumber *)uprv_malloc_63((ulong)(uVar11 + 0xb));
      local_288 = res_00;
      if (res_00 == (decNumber *)0x0) {
        *(byte *)status = (byte)*status | 0x10;
        pdVar9 = (decNumber *)0x0;
        local_288 = (decNumber *)0x0;
        goto LAB_002c33d2;
      }
    }
    uVar12 = local_250;
    uVar11 = iVar7 + 4;
    if (iVar7 < 0x2e) {
      uVar11 = (uint)""[(long)iVar7 + 4];
    }
    if (uVar11 < 0x56) {
      dest = buft;
      local_278 = (decNumber *)0x0;
      local_268 = res;
    }
    else {
      local_268 = res;
      dest = (decNumber *)uprv_malloc_63((ulong)(uVar11 + 0xb));
      local_278 = dest;
      if (dest == (decNumber *)0x0) {
        *(byte *)status = (byte)*status | 0x10;
        pdVar9 = (decNumber *)0x0;
        res = local_268;
        goto LAB_002c33d2;
      }
    }
    iVar7 = uVar4 + (int)uVar12 + 2;
    local_260 = lVar2;
    uprv_decNumberCopy_63(dest,pdVar9);
    res_00->bits = '\0';
    res_00->lsu[0] = '\x01';
    res_00->digits = 1;
    res_00->exponent = 0;
    local_1d8[0].bits = '\0';
    local_1d8[0].lsu[0] = '\x02';
    local_1d8[0].digits = 1;
    local_1d8[0].exponent = 0;
    local_224.bits = '\0';
    local_224.lsu[0] = '\x01';
    local_224.digits = 1;
    local_224.exponent = 0;
    uprv_decContextDefault_63(&tset,0x40);
    dset.status = tset.status;
    dset.clamp = tset.clamp;
    dset._25_3_ = tset._25_3_;
    local_240.digits = (int32_t)local_260;
    local_260 = CONCAT44(local_260._4_4_,iVar7);
    tset.emin = -999999999;
    tset.digits = iVar7;
    while( true ) {
      decAddOp(res_00,res_00,dest,&local_240,'\0',status);
      decMultiplyOp(dest,dest,pdVar9,&tset,&ignore);
      decDivideOp(dest,dest,local_1d8,&tset,0x80,&ignore);
      if (((int)local_260 <= res_00->digits) &&
         (dest->digits + (int)local_260 + dest->exponent < res_00->digits + res_00->exponent))
      break;
      decAddOp(local_1d8,local_1d8,&local_224,&dset,'\0',&ignore);
    }
    pdVar9 = res_00;
    uVar12 = local_250;
    iVar7 = (int)local_260;
    if (0 < (int)local_258) goto LAB_002c32c2;
  }
  else {
    res_00 = local_148;
    local_148[0].bits = '\0';
    local_148[0].lsu[0] = '\x02';
    local_148[0].digits = 1;
    local_148[0].exponent = 0;
    if ((char)rhs->bits < '\0') {
      local_148[0].digits = 1;
      local_148[0].exponent = -2;
    }
    local_288 = (decNumber *)0x0;
    local_278 = (decNumber *)0x0;
    local_270 = (decNumber *)0x0;
    uVar12 = 8;
    dest = buft;
    iVar7 = 9;
    local_268 = res;
LAB_002c32c2:
    pdVar9 = dest;
    uVar8 = DECPOWERS[uVar12 & 0xffffffff];
    local_240.digits = iVar7 + 2;
    pdVar9->bits = '\0';
    pdVar9->lsu[0] = '\x01';
    pdVar9->digits = 1;
    pdVar9->exponent = 0;
    bVar5 = false;
    iVar7 = 0x1e;
    while (((*status & 0x2200) == 0 ||
           (((*status >> 9 & 1) == 0 &&
            (((pdVar9->lsu[0] != '\0' || (pdVar9->digits != 1)) || ((pdVar9->bits & 0x70) != 0))))))
          ) {
      uVar8 = uVar8 * 2;
      if ((int)uVar8 < 0) {
        decMultiplyOp(pdVar9,pdVar9,res_00,&local_240,status);
        bVar5 = true;
        if (iVar7 == 0) break;
LAB_002c334b:
        decMultiplyOp(pdVar9,pdVar9,pdVar9,&local_240,status);
      }
      else {
        if (iVar7 == 0) break;
        if (bVar5) goto LAB_002c334b;
        bVar5 = false;
      }
      iVar7 = iVar7 + -1;
    }
  }
  set_00 = local_248;
  res = local_268;
  residue = 1;
  if (((pdVar9->lsu[0] == '\0') && (pdVar9->digits == 1)) && ((pdVar9->bits & 0x70) == 0)) {
    residue = 0;
  }
  local_240.digits = local_248->digits;
  decCopyFit(local_268,pdVar9,&local_240,&residue,status);
  decFinalize(res,set_00,&residue,status);
  pdVar9 = local_278;
LAB_002c33d2:
  if (local_270 != (decNumber *)0x0) {
    uprv_free_63(local_270);
  }
  if (local_288 != (decNumber *)0x0) {
    uprv_free_63(local_288);
  }
  if (pdVar9 == (decNumber *)0x0) {
    return res;
  }
  uprv_free_63(pdVar9);
  return res;
}

Assistant:

decNumber * decExpOp(decNumber *res, const decNumber *rhs,
                         decContext *set, uInt *status) {
  uInt ignore=0;                   /* working status  */
  Int h;                           /* adjusted exponent for 0.xxxx  */
  Int p;                           /* working precision  */
  Int residue;                     /* rounding residue  */
  uInt needbytes;                  /* for space calculations  */
  const decNumber *x=rhs;          /* (may point to safe copy later)  */
  decContext aset, tset, dset;     /* working contexts  */
  Int comp;                        /* work  */

  /* the argument is often copied to normalize it, so (unusually) it  */
  /* is treated like other buffers, using DECBUFFER, +1 in case  */
  /* DECBUFFER is 0  */
  decNumber bufr[D2N(DECBUFFER*2+1)];
  decNumber *allocrhs=NULL;        /* non-NULL if rhs buffer allocated  */

  /* the working precision will be no more than set->digits+8+1  */
  /* so for on-stack buffers DECBUFFER+9 is used, +1 in case DECBUFFER  */
  /* is 0 (and twice that for the accumulator)  */

  /* buffer for t, term (working precision plus)  */
  decNumber buft[D2N(DECBUFFER*2+9+1)];
  decNumber *allocbuft=NULL;       /* -> allocated buft, iff allocated  */
  decNumber *t=buft;               /* term  */
  /* buffer for a, accumulator (working precision * 2), at least 9  */
  decNumber bufa[D2N(DECBUFFER*4+18+1)];
  decNumber *allocbufa=NULL;       /* -> allocated bufa, iff allocated  */
  decNumber *a=bufa;               /* accumulator  */
  /* decNumber for the divisor term; this needs at most 9 digits  */
  /* and so can be fixed size [16 so can use standard context]  */
  decNumber bufd[D2N(16)];
  decNumber *d=bufd;               /* divisor  */
  decNumber numone;                /* constant 1  */

  #if DECCHECK
  Int iterations=0;                /* for later sanity check  */
  if (decCheckOperands(res, DECUNUSED, rhs, set)) return res;
  #endif

  do {                                  /* protect allocated storage  */
    if (SPECIALARG) {                   /* handle infinities and NaNs  */
      if (decNumberIsInfinite(rhs)) {   /* an infinity  */
        if (decNumberIsNegative(rhs))   /* -Infinity -> +0  */
          uprv_decNumberZero(res);
         else uprv_decNumberCopy(res, rhs);  /* +Infinity -> self  */
        }
       else decNaNs(res, rhs, NULL, set, status); /* a NaN  */
      break;}

    if (ISZERO(rhs)) {                  /* zeros -> exact 1  */
      uprv_decNumberZero(res);               /* make clean 1  */
      *res->lsu=1;                      /* ..  */
      break;}                           /* [no status to set]  */

    /* e**x when 0 < x < 0.66 is < 1+3x/2, hence can fast-path  */
    /* positive and negative tiny cases which will result in inexact  */
    /* 1.  This also allows the later add-accumulate to always be  */
    /* exact (because its length will never be more than twice the  */
    /* working precision).  */
    /* The comparator (tiny) needs just one digit, so use the  */
    /* decNumber d for it (reused as the divisor, etc., below); its  */
    /* exponent is such that if x is positive it will have  */
    /* set->digits-1 zeros between the decimal point and the digit,  */
    /* which is 4, and if x is negative one more zero there as the  */
    /* more precise result will be of the form 0.9999999 rather than  */
    /* 1.0000001.  Hence, tiny will be 0.0000004  if digits=7 and x>0  */
    /* or 0.00000004 if digits=7 and x<0.  If RHS not larger than  */
    /* this then the result will be 1.000000  */
    uprv_decNumberZero(d);                   /* clean  */
    *d->lsu=4;                          /* set 4 ..  */
    d->exponent=-set->digits;           /* * 10**(-d)  */
    if (decNumberIsNegative(rhs)) d->exponent--;  /* negative case  */
    comp=decCompare(d, rhs, 1);         /* signless compare  */
    if (comp==BADINT) {
      *status|=DEC_Insufficient_storage;
      break;}
    if (comp>=0) {                      /* rhs < d  */
      Int shift=set->digits-1;
      uprv_decNumberZero(res);               /* set 1  */
      *res->lsu=1;                      /* ..  */
      res->digits=decShiftToMost(res->lsu, 1, shift);
      res->exponent=-shift;                  /* make 1.0000...  */
      *status|=DEC_Inexact | DEC_Rounded;    /* .. inexactly  */
      break;} /* tiny  */

    /* set up the context to be used for calculating a, as this is  */
    /* used on both paths below  */
    uprv_decContextDefault(&aset, DEC_INIT_DECIMAL64);
    /* accumulator bounds are as requested (could underflow)  */
    aset.emax=set->emax;                /* usual bounds  */
    aset.emin=set->emin;                /* ..  */
    aset.clamp=0;                       /* and no concrete format  */

    /* calculate the adjusted (Hull & Abrham) exponent (where the  */
    /* decimal point is just to the left of the coefficient msd)  */
    h=rhs->exponent+rhs->digits;
    /* if h>8 then 10**h cannot be calculated safely; however, when  */
    /* h=8 then exp(|rhs|) will be at least exp(1E+7) which is at  */
    /* least 6.59E+4342944, so (due to the restriction on Emax/Emin)  */
    /* overflow (or underflow to 0) is guaranteed -- so this case can  */
    /* be handled by simply forcing the appropriate excess  */
    if (h>8) {                          /* overflow/underflow  */
      /* set up here so Power call below will over or underflow to  */
      /* zero; set accumulator to either 2 or 0.02  */
      /* [stack buffer for a is always big enough for this]  */
      uprv_decNumberZero(a);
      *a->lsu=2;                        /* not 1 but < exp(1)  */
      if (decNumberIsNegative(rhs)) a->exponent=-2; /* make 0.02  */
      h=8;                              /* clamp so 10**h computable  */
      p=9;                              /* set a working precision  */
      }
     else {                             /* h<=8  */
      Int maxlever=(rhs->digits>8?1:0);
      /* [could/should increase this for precisions >40 or so, too]  */

      /* if h is 8, cannot normalize to a lower upper limit because  */
      /* the final result will not be computable (see notes above),  */
      /* but leverage can be applied whenever h is less than 8.  */
      /* Apply as much as possible, up to a MAXLEVER digits, which  */
      /* sets the tradeoff against the cost of the later a**(10**h).  */
      /* As h is increased, the working precision below also  */
      /* increases to compensate for the "constant digits at the  */
      /* front" effect.  */
      Int lever=MINI(8-h, maxlever);    /* leverage attainable  */
      Int use=-rhs->digits-lever;       /* exponent to use for RHS  */
      h+=lever;                         /* apply leverage selected  */
      if (h<0) {                        /* clamp  */
        use+=h;                         /* [may end up subnormal]  */
        h=0;
        }
      /* Take a copy of RHS if it needs normalization (true whenever x>=1)  */
      if (rhs->exponent!=use) {
        decNumber *newrhs=bufr;         /* assume will fit on stack  */
        needbytes=sizeof(decNumber)+(D2U(rhs->digits)-1)*sizeof(Unit);
        if (needbytes>sizeof(bufr)) {   /* need malloc space  */
          allocrhs=(decNumber *)malloc(needbytes);
          if (allocrhs==NULL) {         /* hopeless -- abandon  */
            *status|=DEC_Insufficient_storage;
            break;}
          newrhs=allocrhs;              /* use the allocated space  */
          }
        uprv_decNumberCopy(newrhs, rhs);     /* copy to safe space  */
        newrhs->exponent=use;           /* normalize; now <1  */
        x=newrhs;                       /* ready for use  */
        /* decNumberShow(x);  */
        }

      /* Now use the usual power series to evaluate exp(x).  The  */
      /* series starts as 1 + x + x^2/2 ... so prime ready for the  */
      /* third term by setting the term variable t=x, the accumulator  */
      /* a=1, and the divisor d=2.  */

      /* First determine the working precision.  From Hull & Abrham  */
      /* this is set->digits+h+2.  However, if x is 'over-precise' we  */
      /* need to allow for all its digits to potentially participate  */
      /* (consider an x where all the excess digits are 9s) so in  */
      /* this case use x->digits+h+2  */
      p=MAXI(x->digits, set->digits)+h+2;    /* [h<=8]  */

      /* a and t are variable precision, and depend on p, so space  */
      /* must be allocated for them if necessary  */

      /* the accumulator needs to be able to hold 2p digits so that  */
      /* the additions on the second and subsequent iterations are  */
      /* sufficiently exact.  */
      needbytes=sizeof(decNumber)+(D2U(p*2)-1)*sizeof(Unit);
      if (needbytes>sizeof(bufa)) {     /* need malloc space  */
        allocbufa=(decNumber *)malloc(needbytes);
        if (allocbufa==NULL) {          /* hopeless -- abandon  */
          *status|=DEC_Insufficient_storage;
          break;}
        a=allocbufa;                    /* use the allocated space  */
        }
      /* the term needs to be able to hold p digits (which is  */
      /* guaranteed to be larger than x->digits, so the initial copy  */
      /* is safe); it may also be used for the raise-to-power  */
      /* calculation below, which needs an extra two digits  */
      needbytes=sizeof(decNumber)+(D2U(p+2)-1)*sizeof(Unit);
      if (needbytes>sizeof(buft)) {     /* need malloc space  */
        allocbuft=(decNumber *)malloc(needbytes);
        if (allocbuft==NULL) {          /* hopeless -- abandon  */
          *status|=DEC_Insufficient_storage;
          break;}
        t=allocbuft;                    /* use the allocated space  */
        }

      uprv_decNumberCopy(t, x);              /* term=x  */
      uprv_decNumberZero(a); *a->lsu=1;      /* accumulator=1  */
      uprv_decNumberZero(d); *d->lsu=2;      /* divisor=2  */
      uprv_decNumberZero(&numone); *numone.lsu=1; /* constant 1 for increment  */

      /* set up the contexts for calculating a, t, and d  */
      uprv_decContextDefault(&tset, DEC_INIT_DECIMAL64);
      dset=tset;
      /* accumulator bounds are set above, set precision now  */
      aset.digits=p*2;                  /* double  */
      /* term bounds avoid any underflow or overflow  */
      tset.digits=p;
      tset.emin=DEC_MIN_EMIN;           /* [emax is plenty]  */
      /* [dset.digits=16, etc., are sufficient]  */

      /* finally ready to roll  */
      for (;;) {
        #if DECCHECK
        iterations++;
        #endif
        /* only the status from the accumulation is interesting  */
        /* [but it should remain unchanged after first add]  */
        decAddOp(a, a, t, &aset, 0, status);           /* a=a+t  */
        decMultiplyOp(t, t, x, &tset, &ignore);        /* t=t*x  */
        decDivideOp(t, t, d, &tset, DIVIDE, &ignore);  /* t=t/d  */
        /* the iteration ends when the term cannot affect the result,  */
        /* if rounded to p digits, which is when its value is smaller  */
        /* than the accumulator by p+1 digits.  There must also be  */
        /* full precision in a.  */
        if (((a->digits+a->exponent)>=(t->digits+t->exponent+p+1))
            && (a->digits>=p)) break;
        decAddOp(d, d, &numone, &dset, 0, &ignore);    /* d=d+1  */
        } /* iterate  */

      #if DECCHECK
      /* just a sanity check; comment out test to show always  */
      if (iterations>p+3)
        printf("Exp iterations=%ld, status=%08lx, p=%ld, d=%ld\n",
               (LI)iterations, (LI)*status, (LI)p, (LI)x->digits);
      #endif
      } /* h<=8  */

    /* apply postconditioning: a=a**(10**h) -- this is calculated  */
    /* at a slightly higher precision than Hull & Abrham suggest  */
    if (h>0) {
      Int seenbit=0;               /* set once a 1-bit is seen  */
      Int i;                       /* counter  */
      Int n=powers[h];             /* always positive  */
      aset.digits=p+2;             /* sufficient precision  */
      /* avoid the overhead and many extra digits of decNumberPower  */
      /* as all that is needed is the short 'multipliers' loop; here  */
      /* accumulate the answer into t  */
      uprv_decNumberZero(t); *t->lsu=1; /* acc=1  */
      for (i=1;;i++){              /* for each bit [top bit ignored]  */
        /* abandon if have had overflow or terminal underflow  */
        if (*status & (DEC_Overflow|DEC_Underflow)) { /* interesting?  */
          if (*status&DEC_Overflow || ISZERO(t)) break;}
        n=n<<1;                    /* move next bit to testable position  */
        if (n<0) {                 /* top bit is set  */
          seenbit=1;               /* OK, have a significant bit  */
          decMultiplyOp(t, t, a, &aset, status); /* acc=acc*x  */
          }
        if (i==31) break;          /* that was the last bit  */
        if (!seenbit) continue;    /* no need to square 1  */
        decMultiplyOp(t, t, t, &aset, status); /* acc=acc*acc [square]  */
        } /*i*/ /* 32 bits  */
      /* decNumberShow(t);  */
      a=t;                         /* and carry on using t instead of a  */
      }

    /* Copy and round the result to res  */
    residue=1;                          /* indicate dirt to right ..  */
    if (ISZERO(a)) residue=0;           /* .. unless underflowed to 0  */
    aset.digits=set->digits;            /* [use default rounding]  */
    decCopyFit(res, a, &aset, &residue, status); /* copy & shorten  */
    decFinish(res, set, &residue, status);       /* cleanup/set flags  */
    } while(0);                         /* end protected  */

  if (allocrhs !=NULL) free(allocrhs);  /* drop any storage used  */
  if (allocbufa!=NULL) free(allocbufa); /* ..  */
  if (allocbuft!=NULL) free(allocbuft); /* ..  */
  /* [status is handled by caller]  */
  return res;
  }